

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_printf(array_container_t *v)

{
  int local_14;
  int i;
  array_container_t *v_local;
  
  if (v->cardinality == 0) {
    printf("{}");
  }
  else {
    printf("{");
    printf("%d",(ulong)*v->array);
    for (local_14 = 1; local_14 < v->cardinality; local_14 = local_14 + 1) {
      printf(",%d",(ulong)v->array[local_14]);
    }
    printf("}");
  }
  return;
}

Assistant:

void array_container_printf(const array_container_t *v) {
    if (v->cardinality == 0) {
        printf("{}");
        return;
    }
    printf("{");
    printf("%d", v->array[0]);
    for (int i = 1; i < v->cardinality; ++i) {
        printf(",%d", v->array[i]);
    }
    printf("}");
}